

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<float>::SolveSOR
          (TPZMatrix<float> *this,int64_t *numiterations,TPZFMatrix<float> *F,
          TPZFMatrix<float> *result,TPZFMatrix<float> *residual,TPZFMatrix<float> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int64_t j;
  long lVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float local_98;
  long lVar5;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<float> *)0x0) {
    fVar13 = (float)*tol + (float)*tol + 1.0;
  }
  else {
    fVar13 = Dot<float>(residual,residual);
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar5 = CONCAT44(extraout_var,iVar4);
  lVar11 = 0;
  bVar12 = direction != -1;
  lVar6 = lVar5 + -1;
  if (bVar12) {
    lVar6 = lVar11;
  }
  lVar7 = -1;
  if (bVar12) {
    lVar7 = lVar5;
  }
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    lVar11 = 0;
    do {
      if ((double)ABS(fVar13) <= ABS(*tol)) break;
      if (lVar1 < 1) {
        fVar13 = 0.0;
      }
      else {
        fVar13 = 0.0;
        lVar8 = 0;
        lVar9 = 0;
        lVar3 = lVar6;
        do {
          for (; lVar3 != lVar7; lVar3 = lVar3 + (ulong)bVar12 * 2 + -1) {
            (*(F->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(F,lVar3,lVar9);
            local_98 = extraout_XMM0_Da;
            if (0 < lVar5) {
              lVar10 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar3,lVar10);
                lVar2 = (result->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
                if ((lVar2 <= lVar10) ||
                   ((result->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar9)) {
                  TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_98 = local_98 -
                           extraout_XMM0_Da_00 *
                           *(float *)((long)result->fElem + lVar10 * 4 + lVar2 * lVar8);
                lVar10 = lVar10 + 1;
              } while (lVar5 != lVar10);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3)
            ;
            if (((lVar3 < 0) ||
                (lVar10 = (result->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow, lVar10 <= lVar3
                )) || ((result->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = lVar10 * lVar9;
            fVar13 = fVar13 + local_98 * local_98;
            result->fElem[lVar10 + lVar3] =
                 (local_98 * (float)overrelax) / extraout_XMM0_Da_01 + result->fElem[lVar10 + lVar3]
            ;
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 4;
          lVar3 = lVar6;
        } while (lVar9 != lVar1);
      }
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *numiterations);
  }
  if (residual != (TPZFMatrix<float> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,residual);
  }
  *numiterations = lVar11;
  *tol = (double)ABS(fVar13);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}